

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal_replay.cpp
# Opt level: O0

void __thiscall duckdb::WriteAheadLogDeserializer::ReplayDropView(WriteAheadLogDeserializer *this)

{
  bool bVar1;
  WriteAheadLogDeserializer *in_RDI;
  DropInfo *in_stack_00000030;
  ClientContext *in_stack_00000038;
  Catalog *in_stack_00000040;
  DropInfo info;
  DropInfo *this_00;
  _func_int **in_stack_ffffffffffffff28;
  undefined6 in_stack_ffffffffffffff30;
  field_id_t in_stack_ffffffffffffff36;
  Deserializer *in_stack_ffffffffffffff38;
  string local_a8 [41];
  undefined1 local_7f;
  string local_58 [32];
  string local_38 [56];
  
  DropInfo::DropInfo((DropInfo *)CONCAT26(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30));
  local_7f = 3;
  Deserializer::ReadProperty<std::__cxx11::string>
            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff36,(char *)in_stack_ffffffffffffff28);
  ::std::__cxx11::string::operator=(local_58,local_a8);
  ::std::__cxx11::string::~string(local_a8);
  Deserializer::ReadProperty<std::__cxx11::string>
            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff36,(char *)in_stack_ffffffffffffff28);
  this_00 = (DropInfo *)&stack0xffffffffffffff28;
  ::std::__cxx11::string::operator=(local_38,(string *)this_00);
  ::std::__cxx11::string::~string((string *)this_00);
  bVar1 = DeserializeOnly(in_RDI);
  if (!bVar1) {
    Catalog::DropEntry(in_stack_00000040,in_stack_00000038,in_stack_00000030);
  }
  DropInfo::~DropInfo(this_00);
  return;
}

Assistant:

void WriteAheadLogDeserializer::ReplayDropView() {
	DropInfo info;
	info.type = CatalogType::VIEW_ENTRY;
	info.schema = deserializer.ReadProperty<string>(101, "schema");
	info.name = deserializer.ReadProperty<string>(102, "name");
	if (DeserializeOnly()) {
		return;
	}
	catalog.DropEntry(context, info);
}